

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::json_value::json_value(json_value *this,value_t t)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  *pmVar1;
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  *pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  char in_SIL;
  undefined8 *in_RDI;
  string *in_stack_00000030;
  int in_stack_0000003c;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  switch(in_SIL) {
  case '\0':
    *in_RDI = 0;
    break;
  case '\x01':
    pmVar1 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::
             create<std::map<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>>
                       ();
    *in_RDI = pmVar1;
    break;
  case '\x02':
    pvVar2 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::
             create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                       ();
    *in_RDI = pvVar2;
    break;
  case '\x03':
    pbVar3 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::create<std::__cxx11::string,char_const(&)[1]>
                       ((char (*) [1])in_stack_ffffffffffffffe0);
    *in_RDI = pbVar3;
    break;
  case '\x04':
    *(undefined1 *)in_RDI = 0;
    break;
  case '\x05':
    *in_RDI = 0;
    break;
  case '\x06':
    *in_RDI = 0;
    break;
  case '\a':
    *in_RDI = 0;
    break;
  default:
    *in_RDI = 0;
    if (in_SIL == '\0') {
      uVar4 = __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      detail::other_error::create(in_stack_0000003c,in_stack_00000030);
      __cxa_throw(uVar4,&detail::other_error::typeinfo,detail::other_error::~other_error);
    }
  }
  return;
}

Assistant:

json_value(value_t t)
        {
            switch (t)
            {
                case value_t::object:
                {
                    object = create<object_t>();
                    break;
                }

                case value_t::array:
                {
                    array = create<array_t>();
                    break;
                }

                case value_t::string:
                {
                    string = create<string_t>("");
                    break;
                }

                case value_t::boolean:
                {
                    boolean = boolean_t(false);
                    break;
                }

                case value_t::number_integer:
                {
                    number_integer = number_integer_t(0);
                    break;
                }

                case value_t::number_unsigned:
                {
                    number_unsigned = number_unsigned_t(0);
                    break;
                }

                case value_t::number_float:
                {
                    number_float = number_float_t(0.0);
                    break;
                }

                case value_t::null:
                {
                    object = nullptr;  // silence warning, see #821
                    break;
                }

                default:
                {
                    object = nullptr;  // silence warning, see #821
                    if (JSON_UNLIKELY(t == value_t::null))
                    {
                        JSON_THROW(other_error::create(500, "961c151d2e87f2686a955a9be24d316f1362bf21 3.6.1")); // LCOV_EXCL_LINE
                    }
                    break;
                }
            }
        }